

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O0

char16_t *
anon_unknown.dwarf_9c94f::doGetPattern
          (UResourceBundle *res,char *nsName,char *patternKey,UErrorCode *publicStatus,
          UErrorCode *localStatus)

{
  UBool UVar1;
  char *inKey;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece s_02;
  undefined1 local_c8 [12];
  undefined1 local_b8 [12];
  undefined1 local_a8 [2] [12];
  undefined1 local_88 [12];
  undefined1 local_78 [8];
  CharString key;
  UErrorCode *localStatus_local;
  UErrorCode *publicStatus_local;
  char *patternKey_local;
  char *nsName_local;
  UResourceBundle *res_local;
  
  key._56_8_ = localStatus;
  icu_63::CharString::CharString((CharString *)local_78);
  icu_63::StringPiece::StringPiece((StringPiece *)local_88,"NumberElements/");
  s._12_4_ = 0;
  s.ptr_ = (char *)local_88._0_8_;
  s.length_ = local_88._8_4_;
  icu_63::CharString::append((CharString *)local_78,s,publicStatus);
  icu_63::StringPiece::StringPiece((StringPiece *)local_a8,nsName);
  s_00._12_4_ = 0;
  s_00.ptr_ = (char *)local_a8[0]._0_8_;
  s_00.length_ = local_a8[0]._8_4_;
  icu_63::CharString::append((CharString *)local_78,s_00,publicStatus);
  icu_63::StringPiece::StringPiece((StringPiece *)local_b8,"/patterns/");
  s_01._12_4_ = 0;
  s_01.ptr_ = (char *)local_b8._0_8_;
  s_01.length_ = local_b8._8_4_;
  icu_63::CharString::append((CharString *)local_78,s_01,publicStatus);
  icu_63::StringPiece::StringPiece((StringPiece *)local_c8,patternKey);
  s_02._12_4_ = 0;
  s_02.ptr_ = (char *)local_c8._0_8_;
  s_02.length_ = local_c8._8_4_;
  icu_63::CharString::append((CharString *)local_78,s_02,publicStatus);
  UVar1 = ::U_FAILURE(*publicStatus);
  if (UVar1 == '\0') {
    inKey = icu_63::CharString::data((CharString *)local_78);
    res_local = (UResourceBundle *)
                ures_getStringByKeyWithFallback_63
                          (res,inKey,(int32_t *)0x0,(UErrorCode *)key._56_8_);
  }
  else {
    res_local = (UResourceBundle *)0x439bfc;
  }
  icu_63::CharString::~CharString((CharString *)local_78);
  return (char16_t *)res_local;
}

Assistant:

const char16_t*
doGetPattern(UResourceBundle* res, const char* nsName, const char* patternKey, UErrorCode& publicStatus,
             UErrorCode& localStatus) {
    // Construct the path into the resource bundle
    CharString key;
    key.append("NumberElements/", publicStatus);
    key.append(nsName, publicStatus);
    key.append("/patterns/", publicStatus);
    key.append(patternKey, publicStatus);
    if (U_FAILURE(publicStatus)) {
        return u"";
    }
    return ures_getStringByKeyWithFallback(res, key.data(), nullptr, &localStatus);
}